

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

char * SHA256_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_88 [8];
  SHA256_CTX context;
  char *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._56_8_ = digest;
  SHA256_Init((SHA256_CTX *)local_88);
  SHA256_Update((SHA256_CTX *)local_88,data,len);
  pcVar1 = SHA256_End((SHA256_CTX *)local_88,(char *)context.buffer._56_8_);
  return pcVar1;
}

Assistant:

char* SHA256_Data(const sha2_byte* data, size_t len, char digest[SHA256_DIGEST_STRING_LENGTH]) {
	SHA256_CTX	context;

	SHA256_Init(&context);
	SHA256_Update(&context, data, len);
	return SHA256_End(&context, digest);
}